

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceCornerParameterizationQuantity::fillCoordBuffers
          (SurfaceCornerParameterizationQuantity *this,ShaderProgram *p)

{
  undefined1 auStack_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"a_value2","");
  render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *)auStack_48,
             (ManagedBuffer<unsigned_int> *)
             &(this->super_SurfaceParameterizationQuantity).
              super_ParameterizationQuantity<polyscope::SurfaceParameterizationQuantity>.coords);
  (*p->_vptr_ShaderProgram[0x13])(p,local_38,auStack_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void SurfaceCornerParameterizationQuantity::fillCoordBuffers(render::ShaderProgram& p) {
  p.setAttribute("a_value2", coords.getIndexedRenderAttributeBuffer(parent.triangleCornerInds));
}